

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

int scmp(uchar *s1,uchar *s2)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  
  bVar1 = *s1;
  if (bVar1 == 0) {
    uVar2 = 0;
  }
  else {
    pbVar3 = s1 + 1;
    do {
      if (bVar1 != *s2) goto LAB_002516ab;
      s2 = s2 + 1;
      bVar1 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar1 != 0);
    bVar1 = 0;
LAB_002516ab:
    uVar2 = (uint)bVar1;
  }
  return uVar2 - *s2;
}

Assistant:

int scmp( unsigned char *s1, unsigned char *s2 )
{
    while( *s1 != '\0' && *s1 == *s2 )
    {
        s1++;
        s2++;
    }
    return( *s1-*s2 );
}